

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

panel * get_panel_skills(void)

{
  panel *p_00;
  uint8_t attr_00;
  char *pcVar1;
  uint local_68;
  uint local_64;
  int local_60;
  uint local_5c;
  uint local_54;
  int local_4c;
  uint local_48;
  uint local_40;
  int local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  int local_28;
  wchar_t depth;
  char *desc;
  uint8_t attr;
  panel *ppStack_10;
  wchar_t skill;
  panel *p;
  
  ppStack_10 = panel_allocate(L'\b');
  if (cave == (chunk_conflict *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = cave->depth;
  }
  if ((player->state).skills[3] < 1) {
    local_2c = 0;
  }
  else {
    local_2c = (player->state).skills[3];
  }
  if (local_2c < 100) {
    if ((player->state).skills[3] < 1) {
      local_30 = 0;
    }
    else {
      local_30 = (player->state).skills[3];
    }
    local_34 = local_30;
  }
  else {
    local_34 = 100;
  }
  desc._4_4_ = local_34;
  panel_line(ppStack_10,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(int)local_34 / 10],"Saving Throw",
             "%d%%",(ulong)local_34);
  pcVar1 = likert((player->state).skills[5],L'\x01',(uint8_t *)((long)&desc + 3));
  panel_line(ppStack_10,desc._3_1_,"Stealth","%s",pcVar1);
  if ((player->state).skills[0] - local_28 / 5 < 3) {
    local_38 = 2;
  }
  else {
    local_38 = (player->state).skills[0] - local_28 / 5;
  }
  if (local_38 < 100) {
    if ((player->state).skills[0] - local_28 / 5 < 3) {
      local_40 = 2;
    }
    else {
      local_40 = (player->state).skills[0] - local_28 / 5;
    }
    local_48 = local_40;
  }
  else {
    local_48 = 100;
  }
  desc._4_4_ = local_48;
  panel_line(ppStack_10,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(int)local_48 / 10],"Disarm - phys.",
             "%d%%",(ulong)local_48);
  if ((player->state).skills[1] - local_28 / 5 < 3) {
    local_4c = 2;
  }
  else {
    local_4c = (player->state).skills[1] - local_28 / 5;
  }
  if (local_4c < 100) {
    if ((player->state).skills[1] - local_28 / 5 < 3) {
      local_54 = 2;
    }
    else {
      local_54 = (player->state).skills[1] - local_28 / 5;
    }
    local_5c = local_54;
  }
  else {
    local_5c = 100;
  }
  desc._4_4_ = local_5c;
  panel_line(ppStack_10,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(int)local_5c / 10],"Disarm - magic",
             "%d%%",(ulong)local_5c);
  desc._4_4_ = (player->state).skills[2];
  panel_line(ppStack_10,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[desc._4_4_ / 0xd],"Magic Devices",
             "%d",(ulong)(uint)desc._4_4_);
  if ((player->state).skills[4] < 1) {
    local_60 = 0;
  }
  else {
    local_60 = (player->state).skills[4];
  }
  if (local_60 < 100) {
    if ((player->state).skills[4] < 1) {
      local_64 = 0;
    }
    else {
      local_64 = (player->state).skills[4];
    }
    local_68 = local_64;
  }
  else {
    local_68 = 100;
  }
  desc._4_4_ = local_68;
  panel_line(ppStack_10,"\x04\x04\x04\f\x03\v\v\x05\x05\r\x0e"[(int)local_68 / 10],"Searching",
             "%d%%",(ulong)local_68);
  panel_line(ppStack_10,'\r',"Infravision","%d ft",(ulong)(uint)((player->state).see_infra * 10));
  p_00 = ppStack_10;
  desc._4_4_ = (player->state).speed;
  if (*player->timed != 0) {
    desc._4_4_ = desc._4_4_ + L'\xfffffff6';
  }
  if (player->timed[1] != 0) {
    desc._4_4_ = desc._4_4_ + L'\n';
  }
  attr_00 = '\r';
  if (desc._4_4_ < L'n') {
    attr_00 = '\x0f';
  }
  desc._3_1_ = attr_00;
  pcVar1 = show_speed();
  panel_line(p_00,attr_00,"Speed","%s",pcVar1);
  return ppStack_10;
}

Assistant:

static struct panel *get_panel_skills(void) {
	struct panel *p = panel_allocate(8);

	int skill;
	uint8_t attr;
	const char *desc;
	int depth = cave ? cave->depth : 0;

#define BOUND(x, min, max)		MIN(max, MAX(min, x))

	/* Saving throw */
	skill = BOUND(player->state.skills[SKILL_SAVE], 0, 100);
	panel_line(p, colour_table[skill / 10], "Saving Throw", "%d%%", skill);

	/* Stealth */
	desc = likert(player->state.skills[SKILL_STEALTH], 1, &attr);
	panel_line(p, attr, "Stealth", "%s", desc);

	/* Physical disarming: assume we're disarming a dungeon trap */
	skill = BOUND(player->state.skills[SKILL_DISARM_PHYS] - depth / 5, 2, 100);
	panel_line(p, colour_table[skill / 10], "Disarm - phys.", "%d%%", skill);

	/* Magical disarming */
	skill = BOUND(player->state.skills[SKILL_DISARM_MAGIC] - depth / 5, 2, 100);
	panel_line(p, colour_table[skill / 10], "Disarm - magic", "%d%%", skill);

	/* Magic devices */
	skill = player->state.skills[SKILL_DEVICE];
	panel_line(p, colour_table[skill / 13], "Magic Devices", "%d", skill);

	/* Searching ability */
	skill = BOUND(player->state.skills[SKILL_SEARCH], 0, 100);
	panel_line(p, colour_table[skill / 10], "Searching", "%d%%", skill);

	/* Infravision */
	panel_line(p, COLOUR_L_GREEN, "Infravision", "%d ft",
			player->state.see_infra * 10);

	/* Speed */
	skill = player->state.speed;
	if (player->timed[TMD_FAST]) skill -= 10;
	if (player->timed[TMD_SLOW]) skill += 10;
	attr = skill < 110 ? COLOUR_L_UMBER : COLOUR_L_GREEN;
	panel_line(p, attr, "Speed", "%s", show_speed());

	return p;
}